

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trampoline.cpp
# Opt level: O0

Object * scm::trampoline::trampoline(Continuation *startFunction)

{
  bool bVar1;
  Verbosity VVar2;
  Object *obj;
  double __x;
  double __x_00;
  double __x_01;
  byte local_4d;
  string local_38;
  Continuation *local_18;
  Continuation *nextFunction;
  Continuation *startFunction_local;
  
  nextFunction = startFunction;
  VVar2 = loguru::current_verbosity_cutoff();
  if ((-1 < VVar2) && ((LOG_TRAMPOLINE_TRACE & 1) != 0)) {
    loguru::log(__x);
  }
  local_18 = nextFunction;
  pushFunc((Continuation *)0x0);
  for (; local_18 != (Continuation *)0x0; local_18 = (Continuation *)(*local_18)()) {
    VVar2 = loguru::current_verbosity_cutoff();
    if ((-1 < VVar2) && ((LOG_TRAMPOLINE_TRACE & 1) != 0)) {
      loguru::log(__x_00);
    }
  }
  VVar2 = loguru::current_verbosity_cutoff();
  bVar1 = false;
  if (-1 < VVar2) {
    local_4d = 1;
    if ((LOG_TRAMPOLINE_TRACE & 1) == 0) {
      local_4d = LOG_STACK_TRACE;
    }
    if ((local_4d & 1) != 0) {
      toString_abi_cxx11_(&local_38,(scm *)lastReturnValue,obj);
      bVar1 = true;
      std::__cxx11::string::c_str();
      std::
      stack<std::variant<scm::Object_*,_scm::Environment_*,_void_*(*(*)())(),_unsigned_long,_int>,_std::deque<std::variant<scm::Object_*,_scm::Environment_*,_void_*(*(*)())(),_unsigned_long,_int>,_std::allocator<std::variant<scm::Object_*,_scm::Environment_*,_void_*(*(*)())(),_unsigned_long,_int>_>_>_>
      ::size((stack<std::variant<scm::Object_*,_scm::Environment_*,_void_*(*(*)())(),_unsigned_long,_int>,_std::deque<std::variant<scm::Object_*,_scm::Environment_*,_void_*(*(*)())(),_unsigned_long,_int>,_std::allocator<std::variant<scm::Object_*,_scm::Environment_*,_void_*(*(*)())(),_unsigned_long,_int>_>_>_>
              *)argumentStack);
      std::stack<void_*(*(*)())(),_std::deque<void_*(*(*)())(),_std::allocator<void_*(*(*)())()>_>_>
      ::size((stack<void_*(*(*)())(),_std::deque<void_*(*(*)())(),_std::allocator<void_*(*(*)())()>_>_>
              *)functionStack);
      loguru::log(__x_01);
    }
  }
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_38);
  }
  return lastReturnValue;
}

Assistant:

Object* trampoline(Continuation* startFunction)
{
  DLOG_IF_F(INFO, LOG_TRAMPOLINE_TRACE, "in: trampoline");
  Continuation* nextFunction{startFunction};
  pushFunc(NULL);
  while (nextFunction != NULL) {
    DLOG_IF_F(INFO, LOG_TRAMPOLINE_TRACE, "in: trampoline loop");
    nextFunction = (Continuation*)(*nextFunction)();
  }
  DLOG_IF_F(INFO,
            LOG_TRAMPOLINE_TRACE || LOG_STACK_TRACE,
            "trampoline finished | returning %s | argStack: %d | funcStack: %d",
            toString(lastReturnValue).c_str(),
            static_cast<int>(argumentStack.size()),
            static_cast<int>(functionStack.size()));
  return lastReturnValue;
}